

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O3

void __thiscall
cfgfile::tag_scalar_t<QString,_cfgfile::qstring_trait_t>::on_finish
          (tag_scalar_t<QString,_cfgfile::qstring_trait_t> *this,
          parser_info_t<cfgfile::qstring_trait_t> *info)

{
  constraint_t<QString> *pcVar1;
  undefined8 *puVar2;
  tag_t<cfgfile::qstring_trait_t> *this_00;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  logic_error *plVar7;
  undefined8 *puVar8;
  string local_280;
  string_t local_260;
  string local_248;
  string local_228;
  string_t local_208;
  qstring_wrapper_t local_1f0;
  qstring_wrapper_t local_1d8;
  qstring_wrapper_t local_1c0;
  qstring_wrapper_t local_1a8;
  qstring_wrapper_t local_190;
  qstring_wrapper_t local_178;
  qstring_wrapper_t local_160;
  string local_148;
  string local_128;
  qstring_wrapper_t local_108;
  qstring_wrapper_t local_e8;
  qstring_wrapper_t local_c8;
  string_t local_a8;
  string_t local_90;
  string_t local_78;
  string_t local_60;
  string_t local_48;
  
  pcVar1 = this->m_constraint;
  if (pcVar1 != (constraint_t<QString> *)0x0) {
    iVar6 = (*pcVar1->_vptr_constraint_t[2])(pcVar1,&this->m_value);
    if ((char)iVar6 == '\0') {
      plVar7 = (logic_error *)__cxa_allocate_exception(0x28);
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"Invalid value: \"","");
      qstring_trait_t::from_ascii(&local_208,&local_280);
      local_260.m_str.d.d = (this->m_value).d.d;
      local_260.m_str.d.ptr = (this->m_value).d.ptr;
      local_260.m_str.d.size = (this->m_value).d.size;
      if (local_260.m_str.d.d != (Data *)0x0) {
        LOCK();
        ((local_260.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_260.m_str.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
             1;
        UNLOCK();
      }
      operator+(&local_1f0,&local_208,&local_260);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_128,"\". Value must match to the constraint in tag \"","");
      qstring_trait_t::from_ascii(&local_60,&local_128);
      operator+(&local_1d8,&local_1f0,&local_60);
      operator+(&local_1c0,&local_1d8,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"\". In file \"","");
      qstring_trait_t::from_ascii(&local_78,&local_148);
      operator+(&local_1a8,&local_1c0,&local_78);
      operator+(&local_190,&local_1a8,&info->m_file_name);
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"\" on line ","");
      qstring_trait_t::from_ascii(&local_90,&local_248);
      operator+(&local_178,&local_190,&local_90);
      qstring_trait_t::to_string(&local_a8,info->m_line_number);
      operator+(&local_160,&local_178,&local_a8);
      local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,".","");
      qstring_trait_t::from_ascii(&local_48,&local_228);
      operator+(&local_c8,&local_160,&local_48);
      std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
      *(undefined ***)plVar7 = &PTR__exception_t_00121a28;
      *(undefined8 *)(plVar7 + 0x20) = 0;
      uVar3 = local_c8.m_str.d.d._0_4_;
      uVar4 = local_c8.m_str.d.d._4_4_;
      local_c8.m_str.d.d = (Data *)0x0;
      *(undefined4 *)(plVar7 + 0x10) = uVar3;
      *(undefined4 *)(plVar7 + 0x14) = uVar4;
      *(undefined4 *)(plVar7 + 0x18) = local_c8.m_str.d.ptr._0_4_;
      *(undefined4 *)(plVar7 + 0x1c) = local_c8.m_str.d.ptr._4_4_;
      local_c8.m_str.d.ptr = (char16_t *)0x0;
      *(qsizetype *)(plVar7 + 0x20) = local_c8.m_str.d.size;
      local_c8.m_str.d.size = 0;
      __cxa_throw(plVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                  exception_t<cfgfile::qstring_trait_t>::~exception_t);
    }
  }
  if ((this->super_tag_t<cfgfile::qstring_trait_t>).m_is_defined != false) {
    iVar6 = (*(this->super_tag_t<cfgfile::qstring_trait_t>)._vptr_tag_t[2])(this);
    puVar8 = *(undefined8 **)CONCAT44(extraout_var,iVar6);
    puVar2 = (undefined8 *)((undefined8 *)CONCAT44(extraout_var,iVar6))[1];
    do {
      if (puVar8 == puVar2) {
        return;
      }
      this_00 = (tag_t<cfgfile::qstring_trait_t> *)*puVar8;
      if (this_00->m_is_mandatory == true) {
        bVar5 = tag_t<cfgfile::qstring_trait_t>::is_defined(this_00);
        if (!bVar5) {
          plVar7 = (logic_error *)__cxa_allocate_exception(0x28);
          local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_280,"Undefined child mandatory tag: \"","");
          qstring_trait_t::from_ascii(&local_208,&local_280);
          operator+(&local_1f0,&local_208,&this_00->m_name);
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_128,"\". Where parent is: \"","");
          qstring_trait_t::from_ascii(&local_260,&local_128);
          operator+(&local_1d8,&local_1f0,&local_260);
          operator+(&local_1c0,&local_1d8,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"\". In file \"","");
          qstring_trait_t::from_ascii(&local_60,&local_148);
          operator+(&local_1a8,&local_1c0,&local_60);
          operator+(&local_190,&local_1a8,&info->m_file_name);
          local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"\" on line ","");
          qstring_trait_t::from_ascii(&local_78,&local_248);
          operator+(&local_178,&local_190,&local_78);
          qstring_trait_t::to_string(&local_90,info->m_line_number);
          operator+(&local_160,&local_178,&local_90);
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,".","");
          qstring_trait_t::from_ascii(&local_a8,&local_228);
          operator+(&local_108,&local_160,&local_a8);
          std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
          *(undefined ***)plVar7 = &PTR__exception_t_00121a28;
          *(undefined8 *)(plVar7 + 0x20) = 0;
          uVar3 = local_108.m_str.d.d._0_4_;
          uVar4 = local_108.m_str.d.d._4_4_;
          local_108.m_str.d.d = (Data *)0x0;
          *(undefined4 *)(plVar7 + 0x10) = uVar3;
          *(undefined4 *)(plVar7 + 0x14) = uVar4;
          *(undefined4 *)(plVar7 + 0x18) = local_108.m_str.d.ptr._0_4_;
          *(undefined4 *)(plVar7 + 0x1c) = local_108.m_str.d.ptr._4_4_;
          local_108.m_str.d.ptr = (char16_t *)0x0;
          *(qsizetype *)(plVar7 + 0x20) = local_108.m_str.d.size;
          local_108.m_str.d.size = 0;
          __cxa_throw(plVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                      exception_t<cfgfile::qstring_trait_t>::~exception_t);
        }
      }
      puVar8 = puVar8 + 1;
    } while( true );
  }
  plVar7 = (logic_error *)__cxa_allocate_exception(0x28);
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_280,"Undefined value of tag: \"","");
  qstring_trait_t::from_ascii(&local_1c0,&local_280);
  operator+(&local_1a8,&local_1c0,&(this->super_tag_t<cfgfile::qstring_trait_t>).m_name);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"\". In file \"","");
  qstring_trait_t::from_ascii(&local_1d8,&local_128);
  operator+(&local_190,&local_1a8,&local_1d8);
  operator+(&local_178,&local_190,&info->m_file_name);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"\" on line ","");
  qstring_trait_t::from_ascii(&local_1f0,&local_148);
  operator+(&local_160,&local_178,&local_1f0);
  qstring_trait_t::to_string(&local_208,info->m_line_number);
  operator+((qstring_wrapper_t *)&local_228,&local_160,&local_208);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,".","");
  qstring_trait_t::from_ascii(&local_260,&local_248);
  operator+(&local_e8,(qstring_wrapper_t *)&local_228,&local_260);
  std::logic_error::logic_error(plVar7,"Please use desc() method of the exception.");
  *(undefined ***)plVar7 = &PTR__exception_t_00121a28;
  *(undefined8 *)(plVar7 + 0x20) = 0;
  uVar3 = local_e8.m_str.d.d._0_4_;
  uVar4 = local_e8.m_str.d.d._4_4_;
  local_e8.m_str.d.d = (Data *)0x0;
  *(undefined4 *)(plVar7 + 0x10) = uVar3;
  *(undefined4 *)(plVar7 + 0x14) = uVar4;
  *(undefined4 *)(plVar7 + 0x18) = local_e8.m_str.d.ptr._0_4_;
  *(undefined4 *)(plVar7 + 0x1c) = local_e8.m_str.d.ptr._4_4_;
  local_e8.m_str.d.ptr = (char16_t *)0x0;
  *(qsizetype *)(plVar7 + 0x20) = local_e8.m_str.d.size;
  local_e8.m_str.d.size = 0;
  __cxa_throw(plVar7,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
              exception_t<cfgfile::qstring_trait_t>::~exception_t);
}

Assistant:

void on_finish( const parser_info_t< Trait > & info ) override
	{
		if( m_constraint )
		{
			if( !m_constraint->check( m_value ) )
				throw exception_t< Trait >(
					Trait::from_ascii( "Invalid value: \"" ) +
					typename Trait::string_t( m_value ) +
					Trait::from_ascii( "\". Value must match to the "
						"constraint in tag \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}

		if( !this->is_defined_member_value() )
			throw exception_t< Trait >(
				Trait::from_ascii( "Undefined value of tag: \"" ) +
				this->name() + Trait::from_ascii( "\". In file \"" ) +
				info.file_name() + Trait::from_ascii( "\" on line " ) +
				Trait::to_string( info.line_number() ) +
				Trait::from_ascii( "." ) );

		for( const tag_t< Trait > * tag : this->children() )
		{
			if( tag->is_mandatory() && !tag->is_defined() )
				throw exception_t< Trait >(
					Trait::from_ascii( "Undefined child mandatory tag: \"" ) +
					tag->name() + Trait::from_ascii( "\". Where parent is: \"" ) +
					this->name() + Trait::from_ascii( "\". In file \"" ) +
					info.file_name() + Trait::from_ascii( "\" on line " ) +
					Trait::to_string( info.line_number() ) +
					Trait::from_ascii( "." ) );
		}
	}